

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

float * __thiscall cimg_library::CImg<float>::min(CImg<float> *this)

{
  float *pfVar1;
  float fVar2;
  float *pfVar3;
  bool bVar4;
  float *pfVar5;
  CImgInstanceException *this_00;
  float *ptrs;
  float *pfVar6;
  char *pcVar7;
  float fVar8;
  
  bVar4 = is_empty(this);
  if (!bVar4) {
    pfVar5 = this->_data;
    fVar8 = *pfVar5;
    pfVar1 = pfVar5 + (ulong)this->_spectrum * (ulong)this->_depth *
                      (ulong)this->_height * (ulong)this->_width;
    for (pfVar6 = pfVar5; pfVar6 < pfVar1; pfVar6 = pfVar6 + 1) {
      fVar2 = *pfVar6;
      pfVar3 = pfVar6;
      if (fVar8 <= *pfVar6) {
        fVar2 = fVar8;
        pfVar3 = pfVar5;
      }
      pfVar5 = pfVar3;
      fVar8 = fVar2;
    }
    return pfVar5;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar7 = "non-";
  if (this->_is_shared != false) {
    pcVar7 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::min(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar7,"float");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

const T& min() const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_min = _data;
      T min_value = *ptr_min;
      cimg_for(*this,ptrs,T) if (*ptrs<min_value) min_value = *(ptr_min=ptrs);
      return *ptr_min;
    }